

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O3

void __thiscall RX::RX(RX *this)

{
  this->_compiled = false;
  (this->_pattern)._M_dataplus._M_p = (pointer)&(this->_pattern).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_pattern,"");
  this->_case_sensitive = true;
  return;
}

Assistant:

RX::RX ()
: _compiled (false)
, _pattern ("")
, _case_sensitive (true)
{
}